

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  anon_class_8_1_c61d8849 fileSearch;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_32_1_898f2789_for__M_pred fileMatch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_c61d8849 local_288;
  anon_class_8_1_60cb577c local_280;
  long *local_278 [2];
  long local_268 [2];
  undefined1 local_258 [8];
  long *local_250;
  long local_240 [2];
  undefined1 local_230 [520];
  
  memset(local_230,0,0x208);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_258 = (undefined1  [8])local_230;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar1,pcVar1 + name->_M_string_length);
  local_280.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)local_258;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,pcVar1,pcVar1 + name->_M_string_length);
  local_288.fileMatch = (anon_class_32_1_898f2789_for__M_pred *)local_278;
  bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                    (&local_288,&this->PostExcludeFilesStrict);
  bVar3 = true;
  if (!bVar2) {
    bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                      (&local_280,&this->PostIncludeRegexes);
    if (!bVar2) {
      bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                        (&local_288,&this->PostIncludeFiles);
      if (!bVar2) {
        bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                          (&local_280,&this->PostExcludeRegexes);
        if (!bVar2) {
          bVar3 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                            (&local_288,&this->PostExcludeFiles);
        }
        goto LAB_0057622a;
      }
    }
    bVar3 = false;
  }
LAB_0057622a:
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  return bVar3;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };
  auto const fileMatch = [name](const std::string& file) -> bool {
    return cmSystemTools::SameFile(file, name);
  };
  auto const fileSearch =
    [&fileMatch](const std::vector<std::string>& files) -> bool {
    return std::any_of(files.begin(), files.end(), fileMatch);
  };

  return fileSearch(this->PostExcludeFilesStrict) ||
    (!(regexSearch(this->PostIncludeRegexes) ||
       fileSearch(this->PostIncludeFiles)) &&
     (regexSearch(this->PostExcludeRegexes) ||
      fileSearch(this->PostExcludeFiles)));
}